

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O0

string * pybind11::type_id<std::shared_ptr<anurbs::Box<3l>>>(void)

{
  char *__s;
  string *in_RDI;
  allocator<char> local_12;
  undefined1 local_11;
  string *name;
  
  local_11 = 0;
  __s = std::type_info::name((type_info *)&std::shared_ptr<anurbs::Box<3l>>::typeinfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_12);
  std::allocator<char>::~allocator(&local_12);
  detail::clean_type_id(in_RDI);
  return in_RDI;
}

Assistant:

static std::string type_id() {
    std::string name(typeid(T).name());
    detail::clean_type_id(name);
    return name;
}